

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall deqp::egl::anon_unknown_1::FixedFunctionOOB::draw(FixedFunctionOOB *this)

{
  FixedFunctionType FVar1;
  GLint bad_indices [6];
  
  bad_indices[0] = 0;
  bad_indices[1] = 10;
  bad_indices[2] = 100;
  bad_indices[3] = 1000;
  bad_indices[4] = 10000;
  bad_indices[5] = 100000;
  FVar1 = (this->super_ContextReset).m_fixedFunctionType;
  if (FVar1 != FIXEDFUNCTIONTYPE_VERTICES) {
    if (FVar1 == FIXEDFUNCTIONTYPE_INDICES) {
      (*((this->super_ContextReset).m_gl)->drawElements)(4,6,0x1405,bad_indices);
    }
    return;
  }
  (*((this->super_ContextReset).m_gl)->drawArrays)(4,0,1000);
  return;
}

Assistant:

void FixedFunctionOOB::draw (void)
{
	const glw::GLint bad_indices[] = {0, 10, 100, 1000, 10000, 100000};

	if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_INDICES)
		m_gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_INT, bad_indices);
	else if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_VERTICES)
		m_gl.drawArrays(GL_TRIANGLES, 0, 1000);
	else
		DE_FATAL("Unknown fixed function type");
}